

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdi::ControllerWidget::mouseMoveEvent(ControllerWidget *this,QMouseEvent *event)

{
  bool bVar1;
  bool bVar2;
  SubControl SVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  double dVar5;
  double extraout_XMM1_Qa;
  double dVar6;
  undefined8 local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  dVar5 = (double)QEventPoint::position();
  dVar5 = (double)(((ulong)dVar5 >> 0x20 & 0x80000000) << 0x20 | 0x3fe0000000000000) + dVar5;
  bVar1 = 2147483647.0 < dVar5;
  if (dVar5 <= -2147483648.0) {
    dVar5 = -2147483648.0;
  }
  dVar6 = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
          extraout_XMM1_Qa;
  bVar2 = 2147483647.0 < dVar6;
  if (dVar6 <= -2147483648.0) {
    dVar6 = -2147483648.0;
  }
  local_80 = CONCAT44((int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 |
                                   ~-(ulong)bVar2 & (ulong)dVar6),
                      (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 |
                                   ~-(ulong)bVar1 & (ulong)dVar5));
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionComplex::QStyleOptionComplex((QStyleOptionComplex *)&local_78,1,0xf0000);
  QStyleOption::initFrom((QStyleOption *)&local_78,&this->super_QWidget);
  local_38 = (undefined1 *)
             (ulong)(this->visibleControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                    super_QFlagsStorage<QStyle::SubControl>.i;
  pQVar4 = QWidget::style(&this->super_QWidget);
  SVar3 = (**(code **)(*(long *)pQVar4 + 0xd0))
                    (pQVar4,8,(QStyleOptionComplex *)&local_78,&local_80,this);
  QStyleOption::~QStyleOption((QStyleOption *)&local_78);
  if (this->hoverControl != SVar3) {
    this->hoverControl = SVar3;
    QWidget::update(&this->super_QWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ControllerWidget::mouseMoveEvent(QMouseEvent *event)
{
    QStyle::SubControl under_mouse = getSubControl(event->position().toPoint());
    //test if hover state changes
    if (hoverControl != under_mouse) {
        hoverControl = under_mouse;
        update();
    }
}